

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeParseCellPtrIndex(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  u8 *puVar5;
  uint uVar6;
  u16 uVar7;
  ulong uVar8;
  ulong uVar9;
  
  puVar5 = pCell + pPage->childPtrSize;
  bVar1 = pCell[pPage->childPtrSize];
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar6 = bVar1 & 0x7f;
    uVar8 = 0;
    do {
      lVar3 = uVar8 + 1;
      uVar9 = uVar8 + 1;
      uVar6 = puVar5[lVar3] & 0x7f | uVar6 << 7;
      if (6 < uVar8) break;
      uVar8 = uVar9;
    } while ((char)puVar5[lVar3] < '\0');
    puVar5 = puVar5 + uVar9;
  }
  pInfo->nKey = (ulong)uVar6;
  pInfo->nPayload = uVar6;
  pInfo->pPayload = puVar5 + 1;
  if (uVar6 <= pPage->maxLocal) {
    uVar4 = ((int)(puVar5 + 1) - (int)pCell) + uVar6;
    uVar7 = 4;
    if ((uVar4 & 0xfffc) != 0) {
      uVar7 = (u16)uVar4;
    }
    pInfo->nSize = uVar7;
    pInfo->nLocal = (u16)uVar6;
    return;
  }
  uVar2 = pPage->minLocal;
  uVar6 = (pInfo->nPayload - (uint)uVar2) % (pPage->pBt->usableSize - 4) + (uint)uVar2;
  if ((int)(uint)pPage->maxLocal < (int)uVar6) {
    uVar6 = (uint)uVar2;
  }
  pInfo->nLocal = (u16)uVar6;
  pInfo->nSize = (((u16)uVar6 + (short)*(undefined4 *)&pInfo->pPayload) - (short)pCell) + 4;
  return;
}

Assistant:

static void btreeParseCellPtrIndex(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf==0 );
  pIter = pCell + pPage->childPtrSize;
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  pInfo->nKey = nPayload;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==(u32)pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}